

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlDocPtr htmlSAXParseFile(char *filename,char *encoding,htmlSAXHandlerPtr sax,void *userData)

{
  htmlParserCtxtPtr ctxt_00;
  _xmlSAXHandler *local_48;
  htmlSAXHandlerPtr oldsax;
  htmlParserCtxtPtr ctxt;
  htmlDocPtr ret;
  void *userData_local;
  htmlSAXHandlerPtr sax_local;
  char *encoding_local;
  char *filename_local;
  
  local_48 = (_xmlSAXHandler *)0x0;
  xmlInitParser();
  ctxt_00 = htmlCreateFileParserCtxt(filename,encoding);
  if (ctxt_00 == (htmlParserCtxtPtr)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    if (sax != (htmlSAXHandlerPtr)0x0) {
      local_48 = ctxt_00->sax;
      ctxt_00->sax = sax;
      ctxt_00->userData = userData;
    }
    htmlParseDocument(ctxt_00);
    filename_local = (char *)ctxt_00->myDoc;
    if (sax != (htmlSAXHandlerPtr)0x0) {
      ctxt_00->sax = local_48;
      ctxt_00->userData = (void *)0x0;
    }
    htmlFreeParserCtxt(ctxt_00);
  }
  return (htmlDocPtr)filename_local;
}

Assistant:

htmlDocPtr
htmlSAXParseFile(const char *filename, const char *encoding, htmlSAXHandlerPtr sax,
                 void *userData) {
    htmlDocPtr ret;
    htmlParserCtxtPtr ctxt;
    htmlSAXHandlerPtr oldsax = NULL;

    xmlInitParser();

    ctxt = htmlCreateFileParserCtxt(filename, encoding);
    if (ctxt == NULL) return(NULL);
    if (sax != NULL) {
	oldsax = ctxt->sax;
        ctxt->sax = sax;
        ctxt->userData = userData;
    }

    htmlParseDocument(ctxt);

    ret = ctxt->myDoc;
    if (sax != NULL) {
        ctxt->sax = oldsax;
        ctxt->userData = NULL;
    }
    htmlFreeParserCtxt(ctxt);

    return(ret);
}